

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall t_d_generator::init_generator(t_d_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  int __oflag;
  pointer pptVar9;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  ofstream_with_content_based_conditional_update *local_e0;
  string f_types_name;
  string subdir;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  t_program *local_58;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&dir,this);
  iVar3 = mkdir(dir._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&dir);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_types_name,this)
      ;
      std::__cxx11::string::string
                ((string *)&subdir,f_types_name._M_dataplus._M_p,(allocator *)&local_100);
      std::operator+(&dir,&subdir,": ");
      pcVar8 = strerror(*piVar4);
      std::operator+(pbVar7,&dir,pcVar8);
      __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  ptVar1 = (this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_50,"d",(allocator *)&subdir);
  t_program::get_namespace(&dir,ptVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&subdir);
  do {
    lVar5 = std::__cxx11::string::find((char *)&dir,0x2fd4e8);
    if (lVar5 == -1) {
      if (dir._M_string_length != 0) {
        std::operator+(&local_100,&subdir,"/");
        std::operator+(&f_types_name,&local_100,&dir);
        std::__cxx11::string::operator=((string *)&subdir,(string *)&f_types_name);
        std::__cxx11::string::~string((string *)&f_types_name);
        std::__cxx11::string::~string((string *)&local_100);
        iVar3 = mkdir(subdir._M_dataplus._M_p,0x1ff);
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 != 0x11) {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      ((string *)&local_100,subdir._M_dataplus._M_p,(allocator *)&local_78);
            std::operator+(&f_types_name,&local_100,": ");
            pcVar8 = strerror(*piVar4);
            std::operator+(pbVar7,&f_types_name,pcVar8);
            __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
        }
      }
      std::operator+(&f_types_name,&subdir,"/");
      std::__cxx11::string::operator=((string *)&this->package_dir_,(string *)&f_types_name);
      std::__cxx11::string::~string((string *)&f_types_name);
      __rhs = &(this->super_t_oop_generator).super_t_generator.program_name_;
      std::operator+(&local_100,&this->package_dir_,__rhs);
      std::operator+(&f_types_name,&local_100,"_types.d");
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::string
                ((string *)&local_100,f_types_name._M_dataplus._M_p,(allocator *)&local_78);
      local_e0 = &this->f_types_;
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                (local_e0,(char *)&local_100,__oflag);
      std::__cxx11::string::~string((string *)&local_100);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_100,this);
      poVar6 = std::operator<<((ostream *)local_e0,(string *)&local_100);
      poVar6 = std::operator<<(poVar6,"module ");
      render_package_abi_cxx11_
                (&local_78,this,(this->super_t_oop_generator).super_t_generator.program_);
      poVar6 = std::operator<<(poVar6,(string *)&local_78);
      poVar6 = std::operator<<(poVar6,(string *)__rhs);
      poVar6 = std::operator<<(poVar6,"_types;");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_100);
      print_default_imports(this,(ostream *)local_e0);
      local_58 = (this->super_t_oop_generator).super_t_generator.program_;
      pptVar2 = (local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (pptVar9 = (local_58->includes_).
                     super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_start; pptVar9 != pptVar2; pptVar9 = pptVar9 + 1) {
        ptVar1 = *pptVar9;
        poVar6 = std::operator<<((ostream *)local_e0,"public import ");
        render_package_abi_cxx11_(&local_100,this,ptVar1);
        poVar6 = std::operator<<(poVar6,(string *)&local_100);
        poVar6 = std::operator<<(poVar6,(string *)&ptVar1->name_);
        poVar6 = std::operator<<(poVar6,"_types;");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_100);
      }
      if ((local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)local_e0,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&f_types_name);
      std::__cxx11::string::~string((string *)&subdir);
      std::__cxx11::string::~string((string *)&dir);
      return;
    }
    std::operator+(&local_100,&subdir,"/");
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&dir);
    std::operator+(&f_types_name,&local_100,&local_78);
    std::__cxx11::string::operator=((string *)&subdir,(string *)&f_types_name);
    std::__cxx11::string::~string((string *)&f_types_name);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_100);
    iVar3 = mkdir(subdir._M_dataplus._M_p,0x1ff);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&local_100,subdir._M_dataplus._M_p,(allocator *)&local_78);
        std::operator+(&f_types_name,&local_100,": ");
        pcVar8 = strerror(*piVar4);
        std::operator+(pbVar7,&f_types_name,pcVar8);
        __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    std::__cxx11::string::substr((ulong)&f_types_name,(ulong)&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&f_types_name);
    std::__cxx11::string::~string((string *)&f_types_name);
  } while( true );
}

Assistant:

void init_generator() override {
    // Make output directory
    MKDIR(get_out_dir().c_str());

    string dir = program_->get_namespace("d");
    string subdir = get_out_dir();
    string::size_type loc;
    while ((loc = dir.find(".")) != string::npos) {
      subdir = subdir + "/" + dir.substr(0, loc);
      MKDIR(subdir.c_str());
      dir = dir.substr(loc + 1);
    }
    if (!dir.empty()) {
      subdir = subdir + "/" + dir;
      MKDIR(subdir.c_str());
    }

    package_dir_ = subdir + "/";

    // Make output file
    string f_types_name = package_dir_ + program_name_ + "_types.d";
    f_types_.open(f_types_name.c_str());

    // Print header
    f_types_ << autogen_comment() << "module " << render_package(*program_) << program_name_
             << "_types;" << endl << endl;

    print_default_imports(f_types_);

    // Include type modules from other imported programs.
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      f_types_ << "public import " << render_package(*include) << include->get_name()
               << "_types;" << endl;
    }
    if (!includes.empty())
      f_types_ << endl;
  }